

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_valddi.cpp
# Opt level: O0

ze_result_t
validation_layer::zeCommandListAppendQueryKernelTimestamps
          (ze_command_list_handle_t hCommandList,uint32_t numEvents,ze_event_handle_t *phEvents,
          void *dstptr,size_t *pOffsets,ze_event_handle_t hSignalEvent,uint32_t numWaitEvents,
          ze_event_handle_t *phWaitEvents)

{
  code *pcVar1;
  ze_result_t zVar2;
  ze_result_t result_00;
  element_type *this;
  size_type sVar3;
  reference ppvVar4;
  pointer this_00;
  undefined8 in_stack_ffffffffffffff10;
  undefined4 uVar6;
  ze_event_handle_t *pp_Var5;
  size_type sStack_b8;
  ze_result_t result_2;
  size_t i_1;
  ze_result_t driver_result;
  ze_result_t result_1;
  ze_result_t result;
  size_t i;
  size_type numValHandlers;
  ze_pfnCommandListAppendQueryKernelTimestamps_t pfnAppendQueryKernelTimestamps;
  allocator local_71;
  string local_70 [32];
  ze_event_handle_t local_50;
  ze_event_handle_t hSignalEvent_local;
  size_t *pOffsets_local;
  void *dstptr_local;
  ze_event_handle_t *phEvents_local;
  ze_command_list_handle_t p_Stack_28;
  uint32_t numEvents_local;
  ze_command_list_handle_t hCommandList_local;
  
  local_50 = hSignalEvent;
  hSignalEvent_local = (ze_event_handle_t)pOffsets;
  pOffsets_local = (size_t *)dstptr;
  dstptr_local = phEvents;
  phEvents_local._4_4_ = numEvents;
  p_Stack_28 = hCommandList;
  this = std::__shared_ptr_access<loader::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator->((__shared_ptr_access<loader::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                    )(context + 0xd50));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_70,
             "zeCommandListAppendQueryKernelTimestamps(hCommandList, numEvents, phEventsLocal, dstptr, pOffsets, hSignalEvent, numWaitEvents, phWaitEventsLocal)"
             ,&local_71);
  loader::Logger::log_trace(this,(string *)local_70);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  pcVar1 = *(code **)(context + 0x2c0);
  if (pcVar1 == (code *)0x0) {
    hCommandList_local._4_4_ =
         logAndPropagateResult
                   ("zeCommandListAppendQueryKernelTimestamps",ZE_RESULT_ERROR_UNSUPPORTED_FEATURE);
  }
  else {
    sVar3 = std::
            vector<validation_layer::validationChecker_*,_std::allocator<validation_layer::validationChecker_*>_>
            ::size((vector<validation_layer::validationChecker_*,_std::allocator<validation_layer::validationChecker_*>_>
                    *)(context + 0xd30));
    for (_result_1 = 0; uVar6 = (undefined4)((ulong)in_stack_ffffffffffffff10 >> 0x20),
        _result_1 < sVar3; _result_1 = _result_1 + 1) {
      ppvVar4 = std::
                vector<validation_layer::validationChecker_*,_std::allocator<validation_layer::validationChecker_*>_>
                ::operator[]((vector<validation_layer::validationChecker_*,_std::allocator<validation_layer::validationChecker_*>_>
                              *)(context + 0xd30),_result_1);
      in_stack_ffffffffffffff10 = CONCAT44(uVar6,numWaitEvents);
      zVar2 = (*(*ppvVar4)->zeValidation->_vptr_ZEValidationEntryPoints[0x98])
                        ((*ppvVar4)->zeValidation,p_Stack_28,(ulong)phEvents_local._4_4_,
                         dstptr_local,pOffsets_local,hSignalEvent_local,local_50,
                         in_stack_ffffffffffffff10,phWaitEvents);
      if (zVar2 != ZE_RESULT_SUCCESS) {
        zVar2 = logAndPropagateResult("zeCommandListAppendQueryKernelTimestamps",zVar2);
        return zVar2;
      }
    }
    if ((*(byte *)(context + 4) & 1) != 0) {
      this_00 = std::
                unique_ptr<validation_layer::HandleLifetimeValidation,_std::default_delete<validation_layer::HandleLifetimeValidation>_>
                ::operator->((unique_ptr<validation_layer::HandleLifetimeValidation,_std::default_delete<validation_layer::HandleLifetimeValidation>_>
                              *)(context + 0xd48));
      zVar2 = ZEHandleLifetimeValidation::zeCommandListAppendQueryKernelTimestampsPrologue
                        (&this_00->zeHandleLifetime,p_Stack_28,phEvents_local._4_4_,
                         (ze_event_handle_t *)dstptr_local,pOffsets_local,
                         (size_t *)hSignalEvent_local,local_50,numWaitEvents,phWaitEvents);
      if (zVar2 != ZE_RESULT_SUCCESS) {
        zVar2 = logAndPropagateResult("zeCommandListAppendQueryKernelTimestamps",zVar2);
        return zVar2;
      }
    }
    pp_Var5 = phWaitEvents;
    zVar2 = (*pcVar1)(p_Stack_28,phEvents_local._4_4_,dstptr_local,pOffsets_local,hSignalEvent_local
                      ,local_50,numWaitEvents,phWaitEvents);
    for (sStack_b8 = 0; uVar6 = (undefined4)((ulong)pp_Var5 >> 0x20), sStack_b8 < sVar3;
        sStack_b8 = sStack_b8 + 1) {
      ppvVar4 = std::
                vector<validation_layer::validationChecker_*,_std::allocator<validation_layer::validationChecker_*>_>
                ::operator[]((vector<validation_layer::validationChecker_*,_std::allocator<validation_layer::validationChecker_*>_>
                              *)(context + 0xd30),sStack_b8);
      pp_Var5 = (ze_event_handle_t *)CONCAT44(uVar6,numWaitEvents);
      result_00 = (*(*ppvVar4)->zeValidation->_vptr_ZEValidationEntryPoints[0x99])
                            ((*ppvVar4)->zeValidation,p_Stack_28,(ulong)phEvents_local._4_4_,
                             dstptr_local,pOffsets_local,hSignalEvent_local,local_50,pp_Var5,
                             phWaitEvents,zVar2);
      if (result_00 != ZE_RESULT_SUCCESS) {
        zVar2 = logAndPropagateResult("zeCommandListAppendQueryKernelTimestamps",result_00);
        return zVar2;
      }
    }
    hCommandList_local._4_4_ =
         logAndPropagateResult("zeCommandListAppendQueryKernelTimestamps",zVar2);
  }
  return hCommandList_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeCommandListAppendQueryKernelTimestamps(
        ze_command_list_handle_t hCommandList,          ///< [in] handle of the command list
        uint32_t numEvents,                             ///< [in] the number of timestamp events to query
        ze_event_handle_t* phEvents,                    ///< [in][range(0, numEvents)] handles of timestamp events to query
        void* dstptr,                                   ///< [in,out] pointer to memory where ::ze_kernel_timestamp_result_t will
                                                        ///< be written; must be size-aligned.
        const size_t* pOffsets,                         ///< [in][optional][range(0, numEvents)] offset, in bytes, to write
                                                        ///< results; address must be 4byte-aligned and offsets must be
                                                        ///< size-aligned.
        ze_event_handle_t hSignalEvent,                 ///< [in][optional] handle of the event to signal on completion
        uint32_t numWaitEvents,                         ///< [in][optional] number of events to wait on before executing query;
                                                        ///< must be 0 if `nullptr == phWaitEvents`
        ze_event_handle_t* phWaitEvents                 ///< [in][optional][range(0, numWaitEvents)] handle of the events to wait
                                                        ///< on before executing query
        )
    {
        context.logger->log_trace("zeCommandListAppendQueryKernelTimestamps(hCommandList, numEvents, phEventsLocal, dstptr, pOffsets, hSignalEvent, numWaitEvents, phWaitEventsLocal)");

        auto pfnAppendQueryKernelTimestamps = context.zeDdiTable.CommandList.pfnAppendQueryKernelTimestamps;

        if( nullptr == pfnAppendQueryKernelTimestamps )
            return logAndPropagateResult("zeCommandListAppendQueryKernelTimestamps", ZE_RESULT_ERROR_UNSUPPORTED_FEATURE);

        auto numValHandlers = context.validationHandlers.size();
        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zeValidation->zeCommandListAppendQueryKernelTimestampsPrologue( hCommandList, numEvents, phEvents, dstptr, pOffsets, hSignalEvent, numWaitEvents, phWaitEvents );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeCommandListAppendQueryKernelTimestamps", result);
        }


        if( context.enableThreadingValidation ){ 
            //Unimplemented
        }

        
        if(context.enableHandleLifetime ){
            auto result = context.handleLifetime->zeHandleLifetime.zeCommandListAppendQueryKernelTimestampsPrologue( hCommandList, numEvents, phEvents, dstptr, pOffsets, hSignalEvent, numWaitEvents, phWaitEvents );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeCommandListAppendQueryKernelTimestamps", result);
        }

        auto driver_result = pfnAppendQueryKernelTimestamps( hCommandList, numEvents, phEvents, dstptr, pOffsets, hSignalEvent, numWaitEvents, phWaitEvents );

        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zeValidation->zeCommandListAppendQueryKernelTimestampsEpilogue( hCommandList, numEvents, phEvents, dstptr, pOffsets, hSignalEvent, numWaitEvents, phWaitEvents ,driver_result);
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeCommandListAppendQueryKernelTimestamps", result);
        }

        return logAndPropagateResult("zeCommandListAppendQueryKernelTimestamps", driver_result);
    }